

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.h
# Opt level: O0

void __thiscall S2Builder::Graph::VertexInMap::~VertexInMap(VertexInMap *this)

{
  VertexInMap *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->in_edge_begins_);
  std::vector<int,_std::allocator<int>_>::~vector(&this->in_edge_ids_);
  return;
}

Assistant:

VertexInMap() = default;